

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O3

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int i)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  void *__tmp;
  FILE *pFVar4;
  pthread_t *ppVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  void *pvVar7;
  void *__dest;
  long lVar8;
  void *__tmp_2;
  pthread_t *ppVar9;
  ulong uVar10;
  bool bVar11;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  t_arg;
  file_binary<unsigned_long> data_iterator_level;
  char fname_prev [1000];
  char fname_old [1000];
  char fname_curr [1000];
  mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *local_c68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c40;
  int local_c38;
  file_binary<unsigned_long> local_c30;
  undefined1 local_c28 [40];
  int local_c00;
  char local_bf8 [1008];
  bitVector local_808 [21];
  char local_418 [1000];
  
  lVar8 = *(long *)this + (long)i * 0x40;
  local_808[0]._size = *(ulong *)(lVar8 + 8);
  local_808[0]._ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_808[0]._ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_808[0]._ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_808[0]._nchar = (local_808[0]._size >> 6) + 1;
  local_808[0]._bitArray = (uint64_t *)calloc(local_808[0]._nchar,8);
  bitVector::operator=((bitVector *)(lVar8 + 0x10),local_808);
  bitVector::~bitVector(local_808);
  sprintf((char *)local_808,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(i - 2));
  sprintf(local_418,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(uint)i);
  sprintf(local_bf8,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(i - 1));
  if (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
    if (2 < i) {
      unlink((char *)local_808);
    }
    if ((0 < i) && (i < *(int *)(this + 0x18) + -1)) {
      pFVar4 = fopen(local_418,"w");
      *(FILE **)(this + 600) = pFVar4;
    }
  }
  *(undefined8 *)(this + 0x1e8) = 0;
  *(undefined4 *)(this + 0x1e0) = 0;
  *(undefined8 *)(this + 0x200) = 0;
  *(undefined8 *)(this + 0x208) = 0;
  uVar10 = 0xffffffffffffffff;
  if (-1 < (long)*(int *)(this + 0x1e4)) {
    uVar10 = (long)*(int *)(this + 0x1e4) * 8;
  }
  ppVar5 = (pthread_t *)operator_new__(uVar10);
  local_c48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_c40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_c50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pp_Var1 = (_func_int **)
            (input_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_c68 = this;
  local_c60 = input_range;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2 = p_Stack_c50;
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fde0;
  local_c58 = p_Var6 + 1;
  p_Var6[1]._vptr__Sp_counted_base = pp_Var1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = 2;
  }
  bVar11 = p_Stack_c50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_c50 = p_Var6;
  if (bVar11) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  pp_Var1 = (_func_int **)
            (input_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2 = p_Stack_c40;
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fde0;
  local_c48 = p_Var6 + 1;
  p_Var6[1]._vptr__Sp_counted_base = pp_Var1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = 2;
  }
  bVar11 = p_Stack_c40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_c40 = p_Var6;
  if (bVar11) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  local_c38 = i;
  if ((i < 2) || (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0)
     ) {
    if ((this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) &&
       (*(int *)(this + 0x250) < i)) {
      pp_Var1 = *(_func_int ***)(this + 0x220);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      p_Var2 = p_Stack_c50;
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fea8;
      local_c58 = p_Var6 + 1;
      p_Var6[1]._vptr__Sp_counted_base = pp_Var1;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = 2;
      }
      bVar11 = p_Stack_c50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_c50 = p_Var6;
      if (bVar11) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      pp_Var1 = *(_func_int ***)(this + 0x228);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      p_Var2 = p_Stack_c40;
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fea8;
      local_c48 = p_Var6 + 1;
      p_Var6[1]._vptr__Sp_counted_base = pp_Var1;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = 2;
      }
      bVar11 = p_Stack_c40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_c40 = p_Var6;
      if (bVar11) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      if (*(int *)(this + 0x1e4) < 1) goto LAB_0010d9d7;
      lVar8 = 0;
      ppVar9 = ppVar5;
      do {
        pthread_create(ppVar9,(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&local_c68);
        lVar8 = lVar8 + 1;
        iVar3 = *(int *)(this + 0x1e4);
        ppVar9 = ppVar9 + 1;
      } while (lVar8 < iVar3);
    }
    else {
      if (*(int *)(this + 0x1e4) < 1) goto LAB_0010d9d7;
      lVar8 = 0;
      ppVar9 = ppVar5;
      do {
        pthread_create(ppVar9,(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&local_c68);
        lVar8 = lVar8 + 1;
        iVar3 = *(int *)(this + 0x1e4);
        ppVar9 = ppVar9 + 1;
      } while (lVar8 < iVar3);
    }
    if (0 < iVar3) {
      lVar8 = 0;
      do {
        pthread_join(ppVar5[lVar8],(void **)0x0);
        lVar8 = lVar8 + 1;
      } while (lVar8 < *(int *)(this + 0x1e4));
    }
  }
  else {
    file_binary<unsigned_long>::file_binary(&local_c30,local_bf8);
    bfile_iterator<unsigned_long>::bfile_iterator
              ((bfile_iterator<unsigned_long> *)local_c28,local_c30._is);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fe58;
    p_Var6[3]._M_use_count = local_c00;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)local_c28._16_8_;
    p_Var6[1]._M_use_count = local_c28._8_4_;
    p_Var6[1]._M_weak_count = local_c28._12_4_;
    pvVar7 = malloc((long)local_c00 << 3);
    *(void **)&p_Var6[2]._M_use_count = pvVar7;
    memcpy(pvVar7,(void *)local_c28._24_8_,(long)local_c00 << 3);
    p_Var2 = p_Stack_c50;
    p_Var6[3]._vptr__Sp_counted_base = (_func_int **)local_c28._32_8_;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)local_c28._0_8_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = 2;
    }
    bVar11 = p_Stack_c50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c58 = p_Var6 + 1;
    p_Stack_c50 = p_Var6;
    if (bVar11) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    if ((unsigned_long *)local_c28._24_8_ != (unsigned_long *)0x0) {
      free((void *)local_c28._24_8_);
    }
    pvVar7 = malloc(80000);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fe58;
    p_Var6[3]._M_use_count = 10000;
    __dest = malloc(80000);
    p_Var6[1]._M_use_count = 0;
    p_Var6[1]._M_weak_count = 0;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(void **)&p_Var6[2]._M_use_count = __dest;
    memcpy(__dest,pvVar7,80000);
    p_Var2 = p_Stack_c40;
    p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = 2;
    }
    bVar11 = p_Stack_c40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c48 = p_Var6 + 1;
    p_Stack_c40 = p_Var6;
    if (bVar11) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    free(pvVar7);
    if (0 < *(int *)(this + 0x1e4)) {
      lVar8 = 0;
      ppVar9 = ppVar5;
      do {
        pthread_create(ppVar9,(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,boomphf::bfile_iterator<unsigned_long>>
                       ,&local_c68);
        lVar8 = lVar8 + 1;
        ppVar9 = ppVar9 + 1;
      } while (lVar8 < *(int *)(this + 0x1e4));
      if (0 < *(int *)(this + 0x1e4)) {
        lVar8 = 0;
        do {
          pthread_join(ppVar5[lVar8],(void **)0x0);
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)(this + 0x1e4));
      }
    }
    fclose((FILE *)local_c30._is);
  }
LAB_0010d9d7:
  if ((this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) &&
     (*(int *)(this + 0x250) == i)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x220),
               *(size_type *)(this + 0x200));
  }
  operator_delete__(ppVar5);
  if (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
    iVar3 = *(int *)(this + 0x18);
    if (0 < i && i < iVar3 + -1) {
      fflush(*(FILE **)(this + 600));
      fclose(*(FILE **)(this + 600));
      iVar3 = *(int *)(this + 0x18);
    }
    if (iVar3 + -1 == i) {
      unlink(local_bf8);
    }
  }
  if (p_Stack_c40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c40);
  }
  if (p_Stack_c50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c50);
  }
  return;
}

Assistant:

void processLevel(Range const& input_range,int i)
		{
			////alloc the bitset for this level
			_levels[i].bitset =  bitVector(_levels[i].hash_domain); ;

			//printf("---process level %i   wr %i fast %i ---\n",i,_writeEachLevel,_fastmode);
			
			char fname_old[1000];
			sprintf(fname_old,"temp_p%i_level_%i",_pid,i-2);
			
			char fname_curr[1000];
			sprintf(fname_curr,"temp_p%i_level_%i",_pid,i);
			
			char fname_prev[1000];
			sprintf(fname_prev,"temp_p%i_level_%i",_pid,i-1);
			
			if(_writeEachLevel)
			{
				//file management :
				
				if(i>2) //delete previous file
				{
					unlink(fname_old);
				}
				
				if(i< _nb_levels-1 && i > 0 ) //create curr file
				{
					_currlevelFile = fopen(fname_curr,"w");
				}
			}
			
			
			_cptLevel = 0;
			_hashidx = 0;
			_idxLevelsetLevelFastmode =0;
			_nb_living =0;
			//create  threads
			pthread_t *tab_threads= new pthread_t [_num_thread];
			typedef decltype(input_range.begin()) it_type;
			thread_args<Range, it_type> t_arg; // meme arg pour tous
			t_arg.boophf = this;
			t_arg.range = &input_range;
			t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.begin()));
			t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.end()));


			t_arg.level = i;
			
			
			if(_writeEachLevel && (i > 1))
			{

				auto data_iterator_level = file_binary<elem_t>(fname_prev);
				
				typedef decltype(data_iterator_level.begin()) disklevel_it_type;
				
				//data_iterator_level.begin();
				t_arg.it_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.begin()));
				t_arg.until_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.end()));
				
				for(int ii=0;ii<_num_thread;ii++)
					pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, disklevel_it_type>, &t_arg); //&t_arg[ii]
			
			
				//must join here before the block is closed and file_binary is destroyed (and closes the file)
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
				
			}
			
			else
			{
				if(_fastmode && i >= (_fastModeLevel+1))
				{

					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					typedef decltype(setLevelFastmode.begin()) fastmode_it_type;
					t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.begin()));
					t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.end()));
					
					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, fastmode_it_type>, &t_arg); //&t_arg[ii]
					
					
				}
				else
				{
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, decltype(input_range.begin())>, &t_arg); //&t_arg[ii]
				}
				//joining
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
			}
			//printf("\ngoing to level %i  : %llu elems  %.2f %%  expected : %.2f %% \n",i,_cptLevel,100.0* _cptLevel/(float)_nelem,100.0* pow(_proba_collision,i) );

			//printf("\ncpt total processed %llu \n",_cptTotalProcessed);
			if(_fastmode && i == _fastModeLevel) //shrink to actual number of elements in set
			{
				//printf("\nresize setLevelFastmode to %lli \n",_idxLevelsetLevelFastmode);
				setLevelFastmode.resize(_idxLevelsetLevelFastmode);
			}
			delete [] tab_threads;
			
			if(_writeEachLevel)
			{
				if(i< _nb_levels-1 && i>0)
				{
					fflush(_currlevelFile);
					fclose(_currlevelFile);
				}
				
					if(i== _nb_levels- 1) //delete last file
					{
						unlink(fname_prev);
					}
			}

		}